

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall
sptk::reaper::EpochTracker::GetPulseCorrelations
          (EpochTracker *this,float window_dur,float peak_thresh)

{
  short *psVar1;
  float fVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pRVar6;
  pointer psVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  int size;
  size_t peak;
  ulong uVar11;
  size_t i_1;
  long lVar12;
  long lVar13;
  EpochTracker *this_00;
  int start;
  int iVar14;
  vector<float,_std::allocator<float>_> mixture;
  
  fVar2 = this->sample_rate_;
  iVar9 = (int)(fVar2 / this->max_f0_search_ + 0.5);
  this->first_nccf_lag_ = iVar9;
  iVar14 = (int)(fVar2 / this->min_f0_search_ + 0.5);
  size = (int)(window_dur * fVar2 + 0.5);
  this->n_nccf_lags_ = iVar14 - iVar9;
  mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&mixture,(long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->residual_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  pfVar3 = (this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = (this->signal_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar5 = (this->residual_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar13 = 0; (long)pfVar3 - (long)pfVar5 >> 2 != lVar13; lVar13 = lVar13 + 1) {
    mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar13] = pfVar5[lVar13] * 0.7 + pfVar4[lVar13] * 0.3;
  }
  iVar10 = (int)(this->sample_rate_ * 0.001 + 0.5);
  iVar9 = iVar10 * -2;
  for (uVar11 = 0;
      pRVar6 = (this->resid_peaks_).
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)(((long)(this->resid_peaks_).
                              super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6) / 0x70);
      uVar11 = uVar11 + 1) {
    this_00 = (EpochTracker *)&pRVar6[uVar11].nccf;
    start = pRVar6[uVar11].resid_index + size / -2;
    if (start < 1) {
      start = 0;
    }
    if (((ulong)(long)(iVar14 + size + start) <
         (ulong)((long)mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)mixture.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2)) && (iVar10 <= start - iVar9)) {
      CrossCorrelation(this_00,&mixture,start,this->first_nccf_lag_,this->n_nccf_lags_,size,
                       (vector<float,_std::allocator<float>_> *)this_00);
      pRVar6 = (this->resid_peaks_).
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ._M_impl.super__Vector_impl_data._M_start;
      FindNccfPeaks(this_00,&pRVar6[uVar11].nccf,peak_thresh,&pRVar6[uVar11].nccf_periods);
      pRVar6 = (this->resid_peaks_).
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pRVar6[uVar11].nccf_periods.
                         super__Vector_base<short,_std::allocator<short>_>._M_impl;
      psVar7 = *(pointer *)
                ((long)&pRVar6[uVar11].nccf_periods.
                        super__Vector_base<short,_std::allocator<short>_>._M_impl + 8);
      iVar8 = this->first_nccf_lag_;
      for (lVar12 = 0; iVar9 = start, (long)psVar7 - lVar13 >> 1 != lVar12; lVar12 = lVar12 + 1) {
        psVar1 = (short *)(lVar13 + lVar12 * 2);
        *psVar1 = *psVar1 + (short)iVar8;
      }
    }
    else {
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)this_00,&pRVar6[uVar11 - 1].nccf);
      pRVar6 = (this->resid_peaks_).
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<short,_std::allocator<short>_>::operator=
                (&pRVar6[uVar11].nccf_periods,&pRVar6[uVar11 - 1].nccf_periods);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&mixture.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void EpochTracker::GetPulseCorrelations(float window_dur, float peak_thresh) {
  first_nccf_lag_ = RoundUp(sample_rate_ / max_f0_search_);
  int32_t max_lag = RoundUp(sample_rate_ / min_f0_search_);
  n_nccf_lags_ = max_lag - first_nccf_lag_;
  int32_t window_size = RoundUp(window_dur * sample_rate_);
  int32_t half_wind = window_size / 2;
  int32_t frame_size = window_size + max_lag;

  std::vector<float> mixture;
  mixture.resize(residual_.size());
  const float kMinCorrelationStep = 0.001;  // Pulse separation
  // before computing new
  // correlation values.
  const float kResidFract = 0.7;  // Fraction of the residual to use.
  const float kPcmFract = 1.0 - kResidFract;  // Fraction of the input to use.
  for (size_t i = 0; i < residual_.size(); ++i) {
    mixture[i] = (kResidFract * residual_[i]) + (kPcmFract * signal_[i]);
  }

  int32_t min_step = RoundUp(sample_rate_ * kMinCorrelationStep);
  int32_t old_start = - (2.0 * min_step);
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    int32_t start = resid_peaks_[peak].resid_index - half_wind;
    if (start < 0) {
      start = 0;
    }
    size_t end = start + frame_size;
    if ((end >= mixture.size()) || ((start - old_start) < min_step)) {
      resid_peaks_[peak].nccf = resid_peaks_[peak - 1].nccf;
      resid_peaks_[peak].nccf_periods = resid_peaks_[peak - 1].nccf_periods;
    } else {
      CrossCorrelation(mixture, start, first_nccf_lag_, n_nccf_lags_,
                       window_size, &(resid_peaks_[peak].nccf));
      FindNccfPeaks(resid_peaks_[peak].nccf, peak_thresh,
                    &(resid_peaks_[peak].nccf_periods));
      // Turn the peak indices from FindNccfPeaks into NCCF period hyps.
      for (size_t i = 0; i < resid_peaks_[peak].nccf_periods.size(); ++i) {
        resid_peaks_[peak].nccf_periods[i] += first_nccf_lag_;
      }
      old_start = start;
    }
  }
}